

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_internal_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t uVar21;
  ulong auStack_338 [9];
  long local_2f0 [5];
  ulong local_2c8 [83];
  
  lVar7 = 0;
  do {
    uVar1 = *(ulong *)(data + lVar7 * 8);
    local_2c8[lVar7 + 2] =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  lVar7 = 0x10;
  do {
    uVar1 = local_2c8[lVar7];
    uVar2 = auStack_338[lVar7 + 1];
    local_2c8[lVar7 + 2] =
         (uVar1 >> 6 ^ (uVar1 << 3 | uVar1 >> 0x3d) ^ (uVar1 << 0x2d | uVar1 >> 0x13)) +
         local_2f0[lVar7] + auStack_338[lVar7] +
         (uVar2 >> 7 ^
         (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x50);
  uVar1 = ctx->state[1];
  uVar3 = ctx->state[3];
  uVar4 = ctx->state[4];
  uVar5 = ctx->state[5];
  uVar2 = ctx->state[6];
  uVar6 = ctx->state[7];
  uVar19 = 0xfffffffffffffff8;
  uVar8 = ctx->state[0];
  uVar9 = uVar1;
  uVar10 = uVar2;
  uVar12 = uVar4;
  uVar14 = ctx->state[2];
  uVar16 = uVar6;
  uVar18 = uVar3;
  uVar21 = uVar5;
  do {
    lVar7 = ((uVar12 << 0x17 | uVar12 >> 0x29) ^
            (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe)) + uVar16 +
            K[uVar19 + 8] + ((uVar10 ^ uVar21) & uVar12 ^ uVar10) + local_2c8[uVar19 + 10];
    uVar17 = uVar18 + lVar7;
    uVar15 = ((uVar9 | uVar8) & uVar14 | uVar9 & uVar8) +
             ((uVar8 << 0x19 | uVar8 >> 0x27) ^
             (uVar8 << 0x1e | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar7;
    lVar7 = uVar10 + K[uVar19 + 9] + local_2c8[uVar19 + 0xb] + ((uVar21 ^ uVar12) & uVar17 ^ uVar21)
            + ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
              (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
    uVar13 = uVar14 + lVar7;
    uVar10 = lVar7 + ((uVar15 | uVar8) & uVar9 | uVar15 & uVar8) +
                     ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
                     (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c));
    lVar7 = uVar21 + K[uVar19 + 10] + local_2c8[uVar19 + 0xc] +
            ((uVar17 ^ uVar12) & uVar13 ^ uVar12) +
            ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
            (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
    uVar9 = uVar9 + lVar7;
    uVar20 = lVar7 + ((uVar10 | uVar15) & uVar8 | uVar10 & uVar15) +
                     ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
                     (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c));
    lVar7 = uVar12 + K[uVar19 + 0xb] + local_2c8[uVar19 + 0xd] +
            ((uVar13 ^ uVar17) & uVar9 ^ uVar17) +
            ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
            (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
    uVar8 = uVar8 + lVar7;
    uVar11 = lVar7 + ((uVar20 | uVar10) & uVar15 | uVar20 & uVar10) +
                     ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
                     (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c));
    lVar7 = uVar17 + K[uVar19 + 0xc] + local_2c8[uVar19 + 0xe] + ((uVar9 ^ uVar13) & uVar8 ^ uVar13)
            + ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
              (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
    uVar16 = uVar15 + lVar7;
    uVar18 = ((uVar11 | uVar20) & uVar10 | uVar11 & uVar20) +
             ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
             (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar7;
    lVar7 = local_2c8[uVar19 + 0xf] + K[uVar19 + 0xd] + uVar13 + ((uVar8 ^ uVar9) & uVar16 ^ uVar9)
            + ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
              (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
    uVar10 = uVar10 + lVar7;
    uVar14 = ((uVar18 | uVar11) & uVar20 | uVar18 & uVar11) +
             ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
             (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar7;
    lVar7 = local_2c8[uVar19 + 0x10] + K[uVar19 + 0xe] + uVar9 + ((uVar16 ^ uVar8) & uVar10 ^ uVar8)
            + ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
              (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar21 = uVar20 + lVar7;
    uVar9 = ((uVar14 | uVar18) & uVar11 | uVar14 & uVar18) +
            ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
            (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar7;
    lVar7 = local_2c8[uVar19 + 0x11] + K[uVar19 + 0xf] + uVar8 +
            ((uVar10 ^ uVar16) & uVar21 ^ uVar16) +
            ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
            (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
    uVar12 = uVar11 + lVar7;
    uVar8 = ((uVar9 | uVar14) & uVar18 | uVar9 & uVar14) +
            ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
            (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar7;
    uVar19 = uVar19 + 8;
  } while (uVar19 < 0x48);
  ctx->state[0] = uVar8 + ctx->state[0];
  ctx->state[1] = uVar9 + uVar1;
  ctx->state[2] = uVar14 + ctx->state[2];
  ctx->state[3] = uVar18 + uVar3;
  ctx->state[4] = uVar12 + uVar4;
  ctx->state[5] = uVar21 + uVar5;
  ctx->state[6] = uVar10 + uVar2;
  ctx->state[7] = uVar16 + uVar6;
  return 0;
}

Assistant:

int mbedtls_internal_sha512_process( mbedtls_sha512_context *ctx,
                                     const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A, B, C, D, E, F, G, H;

#define  SHR(x,n) (x >> n)
#define ROTR(x,n) (SHR(x,n) | (x << (64 - n)))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) ((x & y) | (z & (x | y)))
#define F1(x,y,z) (z ^ (x & (y ^ z)))

#define P(a,b,c,d,e,f,g,h,x,K)                  \
{                                               \
    temp1 = h + S3(e) + F1(e,f,g) + K + x;      \
    temp2 = S2(a) + F0(a,b,c);                  \
    d += temp1; h = temp1 + temp2;              \
}

    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];
    E = ctx->state[4];
    F = ctx->state[5];
    G = ctx->state[6];
    H = ctx->state[7];
    i = 0;

    do
    {
        P( A, B, C, D, E, F, G, H, W[i], K[i] ); i++;
        P( H, A, B, C, D, E, F, G, W[i], K[i] ); i++;
        P( G, H, A, B, C, D, E, F, W[i], K[i] ); i++;
        P( F, G, H, A, B, C, D, E, W[i], K[i] ); i++;
        P( E, F, G, H, A, B, C, D, W[i], K[i] ); i++;
        P( D, E, F, G, H, A, B, C, W[i], K[i] ); i++;
        P( C, D, E, F, G, H, A, B, W[i], K[i] ); i++;
        P( B, C, D, E, F, G, H, A, W[i], K[i] ); i++;
    }
    while( i < 80 );

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
    ctx->state[4] += E;
    ctx->state[5] += F;
    ctx->state[6] += G;
    ctx->state[7] += H;

    return( 0 );
}